

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O0

bool __thiscall csv::CSVField::try_parse_hex(CSVField *this,int *parsedValue)

{
  ulong uVar1;
  size_t sVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_iterator pvVar5;
  bool bVar6;
  double dVar7;
  undefined1 auVar8 [16];
  int local_7c;
  int digit;
  value_type *ch;
  const_iterator __end1;
  const_iterator __begin1;
  basic_string_view<char,_std::char_traits<char>_> *local_50;
  basic_string_view<char,_std::char_traits<char>_> *__range1;
  size_t base16_exponent;
  size_t digits;
  ulong uStack_30;
  int value_;
  size_t end;
  size_t start;
  int *parsedValue_local;
  CSVField *this_local;
  
  end = 0;
  uStack_30 = 0;
  start = (size_t)parsedValue;
  parsedValue_local = (int *)this;
  while( true ) {
    sVar2 = end;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->sv);
    bVar6 = false;
    if (sVar2 < sVar3) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[](&this->sv,end);
      bVar6 = *pvVar4 == ' ';
    }
    if (!bVar6) break;
    end = end + 1;
  }
  uStack_30 = end;
  while( true ) {
    uVar1 = uStack_30;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&this->sv);
    bVar6 = false;
    if (uVar1 < sVar3) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&this->sv,uStack_30);
      bVar6 = *pvVar4 != ' ';
    }
    if (!bVar6) break;
    uStack_30 = uStack_30 + 1;
  }
  digits._4_4_ = 0;
  base16_exponent = uStack_30 - end;
  __range1 = (basic_string_view<char,_std::char_traits<char>_> *)(base16_exponent - 1);
  if (base16_exponent == 0) {
    this_local._7_1_ = false;
  }
  else {
    ___begin1 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&this->sv,end,base16_exponent);
    local_50 = (basic_string_view<char,_std::char_traits<char>_> *)&__begin1;
    __end1 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_50);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_50);
    for (; __end1 != pvVar5; __end1 = __end1 + 1) {
      switch(*__end1) {
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        local_7c = *__end1 + -0x30;
        break;
      default:
        return false;
      case 'A':
      case 'a':
        local_7c = 10;
        break;
      case 'B':
      case 'b':
        local_7c = 0xb;
        break;
      case 'C':
      case 'c':
        local_7c = 0xc;
        break;
      case 'D':
      case 'd':
        local_7c = 0xd;
        break;
      case 'E':
      case 'e':
        local_7c = 0xe;
        break;
      case 'F':
      case 'f':
        local_7c = 0xf;
      }
      auVar8._8_4_ = (int)((ulong)__range1 >> 0x20);
      auVar8._0_8_ = __range1;
      auVar8._12_4_ = 0x45300000;
      dVar7 = pow(16.0,(auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)__range1) - 4503599627370496.0));
      digits._4_4_ = local_7c * (int)dVar7 + digits._4_4_;
      __range1 = (basic_string_view<char,_std::char_traits<char>_> *)
                 ((long)&__range1[-1]._M_str + 7);
    }
    *(int *)start = digits._4_4_;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

CSV_INLINE bool CSVField::try_parse_hex(int& parsedValue) {
        size_t start = 0, end = 0;

        // Trim out whitespace chars
        for (; start < this->sv.size() && this->sv[start] == ' '; start++);
        for (end = start; end < this->sv.size() && this->sv[end] != ' '; end++);
        
        int value_ = 0;

        size_t digits = (end - start);
        size_t base16_exponent = digits - 1;

        if (digits == 0) return false;

        for (const auto& ch : this->sv.substr(start, digits)) {
            int digit = 0;

            switch (ch) {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                digit = static_cast<int>(ch - '0');
                break;
            case 'a':
            case 'A':
                digit = 10;
                break;
            case 'b':
            case 'B':
                digit = 11;
                break;
            case 'c':
            case 'C':
                digit = 12;
                break;
            case 'd':
            case 'D':
                digit = 13;
                break;
            case 'e':
            case 'E':
                digit = 14;
                break;
            case 'f':
            case 'F':
                digit = 15;
                break;
            default:
                return false;
            }

            value_ += digit * (int)pow(16, (double)base16_exponent);
            base16_exponent--;
        }

        parsedValue = value_;
        return true;
    }